

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O0

peer_class_type_filter * __thiscall
libtorrent::session_handle::
sync_call_ret<libtorrent::peer_class_type_filter,libtorrent::peer_class_type_filter(libtorrent::aux::session_impl::*)()>
          (peer_class_type_filter *__return_storage_ptr__,session_handle *this,
          offset_in_session_impl_to_subr f)

{
  bool bVar1;
  element_type *peVar2;
  io_context *ctx;
  undefined1 auVar3 [12];
  undefined1 local_a0 [8];
  type_conflict7 local_98;
  exception_ptr local_60;
  exception_ptr ex;
  bool done;
  error_code_enum local_44;
  undefined1 local_40 [8];
  shared_ptr<libtorrent::aux::session_impl> s;
  offset_in_session_impl_to_subr f_local;
  session_handle *this_local;
  
  s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)f;
  ::std::weak_ptr<libtorrent::aux::session_impl>::lock
            ((weak_ptr<libtorrent::aux::session_impl> *)local_40);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
  if (!bVar1) {
    local_44 = invalid_session_handle;
    libtorrent::aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              (&local_44);
  }
  ex._M_exception_object._3_1_ = 0;
  peer_class_type_filter::peer_class_type_filter(__return_storage_ptr__);
  ::std::__exception_ptr::exception_ptr::exception_ptr(&local_60);
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
  ctx = libtorrent::aux::session_impl::get_context(peVar2);
  local_98.done = (bool *)((long)&ex._M_exception_object + 3);
  local_98.r = __return_storage_ptr__;
  local_98.ex = &local_60;
  ::std::shared_ptr<libtorrent::aux::session_impl>::shared_ptr
            (&local_98.s,(shared_ptr<libtorrent::aux::session_impl> *)local_40);
  local_98.f = (offset_in_session_impl_to_subr)
               s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::session_handle::sync_call_ret<libtorrent::peer_class_type_filter,libtorrent::peer_class_type_filter(libtorrent::aux::session_impl::*)()>(libtorrent::peer_class_type_filter(libtorrent::aux::session_impl::*)())const::_lambda()_1_>
            (ctx,&local_98,(type *)0x0);
  const::{lambda()#1}::~sync_call_ret((_lambda___1_ *)&local_98);
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_40);
  libtorrent::aux::torrent_wait((bool *)((long)&ex._M_exception_object + 3),peVar2);
  bVar1 = ::std::__exception_ptr::exception_ptr::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_60);
    ::std::shared_ptr<libtorrent::aux::session_impl>::~shared_ptr
              ((shared_ptr<libtorrent::aux::session_impl> *)local_40);
    return __return_storage_ptr__;
  }
  ::std::__exception_ptr::exception_ptr::exception_ptr((exception_ptr *)local_a0,&local_60);
  auVar3 = ::std::rethrow_exception((exception_ptr)local_a0);
  ex._M_exception_object._4_4_ = auVar3._8_4_;
  const::{lambda()#1}::~sync_call_ret((_lambda___1_ *)&local_98);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_60);
  ::std::shared_ptr<libtorrent::aux::session_impl>::~shared_ptr
            ((shared_ptr<libtorrent::aux::session_impl> *)local_40);
  _Unwind_Resume(auVar3._0_8_);
}

Assistant:

Ret session_handle::sync_call_ret(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);

		// this is the flag to indicate the call has completed
		// capture them by pointer to allow everything to be captured by value
		// and simplify the capture expression
		bool done = false;
		Ret r;
		std::exception_ptr ex;
		dispatch(s->get_context(), [=, &r, &done, &ex]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				r = (s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(s->mut);
			done = true;
			s->cond.notify_all();
		});

		aux::torrent_wait(done, *s);
		if (ex) std::rethrow_exception(ex);
		return r;
	}